

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_class
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *this_00;
  Atom *this_01;
  Class local_1c8;
  Reference local_180;
  undefined4 local_e4;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0 [2];
  undefined1 local_b0 [8];
  Class _p;
  string label;
  bool write_local;
  uint16_t *extent_index_local;
  uint16_t write_index_local;
  Class *p_local;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  bVar1 = std::operator!=(&peVar2->label,"");
  if (!bVar1) {
    return false;
  }
  peVar2 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)node);
  std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&_p.type,(ulong)&peVar2->label);
  Class::Class((Class *)local_b0,ANY);
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_d0,node);
  bVar1 = object(this,local_d0,(Class *)local_b0);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_d0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
    bVar1 = marker(this,&local_e0,(Class *)local_b0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      this_local._7_1_ = false;
      goto LAB_00199e9d;
    }
  }
  Class::Class(&local_1c8,ANY);
  Reference::Reference(&local_180,(ulong)write_index,(Class *)local_b0,&local_1c8);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>_>
            ::operator[](&this->local_references,(key_type *)&_p.type);
  Reference::operator=(this_00,&local_180);
  Reference::~Reference(&local_180);
  Class::~Class(&local_1c8);
  if (write) {
    this_01 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(this_01,(Atom *)local_b0);
  }
  this_local._7_1_ = true;
LAB_00199e9d:
  local_e4 = 1;
  Class::~Class((Class *)local_b0);
  std::__cxx11::string::~string((string *)&_p.type);
  return this_local._7_1_;
}

Assistant:

bool Compiler::read_class(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL.
{
    if (node->label != "") {
        std::string label = node->label.substr(0, node->label.size() - 1);
        Class _p;

        if (!object(node, _p)) {
            if (!marker(node, _p)) {
                return false;
            }
        }

        local_references[label] = Reference(write_index, _p, Class());

        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    return false;
}